

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O0

void __thiscall DSDcc::DSDDstar::processHD(DSDDstar *this)

{
  EVP_PKEY_CTX *in_RSI;
  DSDDstar *in_RDI;
  DSDDstar *in_stack_00000590;
  
  if (in_RDI->m_symbolIndexHD == 0x293) {
    reset_header_strings(in_RDI);
    DStarSlowData::init(&in_RDI->m_slowData,in_RSI);
    dstar_header_decode(in_stack_00000590);
    init(in_RDI,(EVP_PKEY_CTX *)0x0);
    in_RDI->m_frameType = DStarVoiceFrame;
    in_RDI->m_voiceFrameCount = 0x14;
    in_RDI->m_dsdDecoder->m_fsmState = DSDprocessDSTAR;
  }
  else {
    in_RDI->m_symbolIndexHD = in_RDI->m_symbolIndexHD + 1;
  }
  return;
}

Assistant:

void DSDDstar::processHD()
{
    if (m_symbolIndexHD == 660-1)
    {
        reset_header_strings();
        m_slowData.init();
        dstar_header_decode();
        init(); // init for DSTAR
        m_frameType = DStarVoiceFrame; // we start on a voice frame
        m_voiceFrameCount = 20;        // we start at one frame before sync
        m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDSTAR; // go to DSTAR
    }
    else
    {
        m_symbolIndexHD++;
    }
}